

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_linked_definitions_section.hpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::
linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
::end_array(linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
            *this)

{
  vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  *pvVar1;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  *this_00;
  error_code eVar2;
  unique_ptr<pstore::repo::linked_definitions_creation_dispatcher,_std::default_delete<pstore::repo::linked_definitions_creation_dispatcher>_>
  local_38;
  unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
  local_30;
  value_type *local_28;
  value_type *data;
  linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
  *this_local;
  
  data = (value_type *)this;
  pvVar1 = gsl::
           not_null<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_*>
           ::operator->(&this->ld_);
  local_28 = std::
             vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
             ::data(pvVar1);
  pvVar1 = gsl::
           not_null<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_*>
           ::operator->(&this->ld_);
  std::
  vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  ::size(pvVar1);
  std::
  make_unique<pstore::repo::linked_definitions_creation_dispatcher,pstore::repo::linked_definitions::value_type_const*const&,pstore::repo::linked_definitions::value_type_const*>
            ((value_type **)&local_38,&local_28);
  std::
  unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>
  ::
  unique_ptr<pstore::repo::linked_definitions_creation_dispatcher,std::default_delete<pstore::repo::linked_definitions_creation_dispatcher>,void>
            ((unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>
              *)&local_30,&local_38);
  this_00 = gsl::not_null::operator_cast_to_back_insert_iterator_((not_null *)&this->out_);
  std::
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  ::operator=(this_00,(value_type *)&local_30);
  std::
  unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
  ::~unique_ptr(&local_30);
  std::
  unique_ptr<pstore::repo::linked_definitions_creation_dispatcher,_std::default_delete<pstore::repo::linked_definitions_creation_dispatcher>_>
  ::~unique_ptr(&local_38);
  eVar2 = rule::pop(&this->super_rule);
  eVar2._4_4_ = 0;
  return eVar2;
}

Assistant:

std::error_code linked_definitions_section<OutputIterator>::end_array () {
                auto const * const data = ld_->data ();
                *out_ = std::make_unique<repo::linked_definitions_creation_dispatcher> (
                    data, data + ld_->size ());
                return pop ();
            }